

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O2

void __thiscall
FIX::HttpConnection::showRow
          (HttpConnection *this,stringstream *s,string *name,string *value,string *url)

{
  ostream *stream;
  TD td;
  CENTER center;
  TR tr;
  TAG TStack_548;
  TAG local_390;
  TAG local_1d8;
  
  stream = (ostream *)(s + 0x10);
  HTML::TR::TR((TR *)&local_1d8,stream);
  HTML::TAG::text(&local_1d8);
  HTML::TD::TD((TD *)&TStack_548,stream);
  HTML::TAG::text<std::__cxx11::string>(&TStack_548,name);
  HTML::TAG::~TAG(&TStack_548);
  HTML::TD::TD((TD *)&TStack_548,stream);
  HTML::TAG::text<std::__cxx11::string>(&TStack_548,value);
  HTML::TAG::~TAG(&TStack_548);
  HTML::TD::TD((TD *)&TStack_548,stream);
  HTML::TAG::text(&TStack_548);
  HTML::CENTER::CENTER((CENTER *)&local_390,stream);
  HTML::TAG::text(&local_390);
  HTML::TAG::~TAG(&local_390);
  HTML::TAG::~TAG(&TStack_548);
  HTML::TAG::~TAG(&local_1d8);
  return;
}

Assistant:

void HttpConnection::showRow(
    std::stringstream &s,
    const std::string &name,
    const std::string &value,
    const std::string &url) {
  {
    TR tr(s);
    tr.text();
    {
      TD td(s);
      td.text(name);
    }
    {
      TD td(s);
      td.text(value);
    }
    {
      TD td(s);
      td.text();
      CENTER center(s);
      center.text();
    }
  }
}